

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  unsigned_short *puVar4;
  vector<unsigned_short> *this_00;
  huffman_encoding_table *extraout_RAX;
  long in_RDX;
  uint uVar5;
  uint32_t f;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t max_freq;
  uint16_vec sym_freq;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<unsigned_short> *in_stack_ffffffffffffff70;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_40;
  undefined4 local_3c;
  undefined1 local_1;
  
  uVar5 = (uint)ctx;
  if ((uVar5 == 0) || (0x4000 < uVar5)) {
    local_1 = 0;
  }
  else {
    vector<unsigned_short>::vector
              (in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_3c = 0;
    for (local_40 = 0; local_40 < uVar5; local_40 = local_40 + 1) {
      local_3c = maximum<unsigned_int>(local_3c,*(uint *)(in_RDX + (ulong)local_40 * 4));
    }
    if (local_3c < 0xffff) {
      for (local_50 = 0; local_50 < uVar5; local_50 = local_50 + 1) {
        uVar1 = *(unsigned_short *)(in_RDX + (ulong)local_50 * 4);
        puVar4 = vector<unsigned_short>::operator[]
                           (in_stack_ffffffffffffff70,
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        *puVar4 = uVar1;
      }
    }
    else {
      for (local_54 = 0; local_54 < uVar5; local_54 = local_54 + 1) {
        if (*(int *)(in_RDX + (ulong)local_54 * 4) != 0) {
          uVar2 = clamp<unsigned_int>((uint)(((ulong)*(uint *)(in_RDX + (ulong)local_54 * 4) *
                                              0xfffe + (ulong)(local_3c >> 1)) / (ulong)local_3c),1,
                                      0xfffe);
          puVar4 = vector<unsigned_short>::operator[]
                             (in_stack_ffffffffffffff70,
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          *puVar4 = (unsigned_short)uVar2;
        }
      }
    }
    this_00 = (vector<unsigned_short> *)
              vector<unsigned_short>::operator[]
                        (in_stack_ffffffffffffff70,CONCAT44(uVar5,in_stack_ffffffffffffff68));
    iVar3 = init(this,(EVP_PKEY_CTX *)(ulong)uVar5);
    local_1 = (byte)iVar3 & 1;
    vector<unsigned_short>::~vector(this_00);
    this = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint32_t *pSym_freq, uint32_t max_code_size)
	{
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint16_vec sym_freq(num_syms);

		uint32_t max_freq = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			max_freq = maximum(max_freq, pSym_freq[i]);

		if (max_freq < UINT16_MAX)
		{
			for (uint32_t i = 0; i < num_syms; i++)
				sym_freq[i] = static_cast<uint16_t>(pSym_freq[i]);
		}
		else
		{
			for (uint32_t i = 0; i < num_syms; i++)
			{
				if (pSym_freq[i])
				{
					uint32_t f = static_cast<uint32_t>((static_cast<uint64_t>(pSym_freq[i]) * 65534U + (max_freq >> 1)) / max_freq);
					sym_freq[i] = static_cast<uint16_t>(clamp<uint32_t>(f, 1, 65534));
				}
			}
		}

		return init(num_syms, &sym_freq[0], max_code_size);
	}